

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  ImVector<ImGuiTextFilter::TextRange> *out;
  int *piVar1;
  int iVar2;
  TextRange *pTVar3;
  char *pcVar4;
  ImGuiContext *pIVar5;
  TextRange *__dest;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  TextRange input_range;
  TextRange local_38;
  
  pIVar5 = GImGui;
  out = &this->Filters;
  iVar2 = (this->Filters).Capacity;
  if (iVar2 < 0) {
    uVar8 = iVar2 / 2 + iVar2;
    uVar7 = 0;
    if (0 < (int)uVar8) {
      uVar7 = (ulong)uVar8;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (TextRange *)(*(pIVar5->IO).MemAllocFn)(uVar7 << 4);
    pTVar3 = (this->Filters).Data;
    if (pTVar3 != (TextRange *)0x0) {
      memcpy(__dest,pTVar3,(long)out->Size << 4);
    }
    pTVar3 = (this->Filters).Data;
    if (pTVar3 != (TextRange *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(pTVar3);
    (this->Filters).Data = __dest;
    (this->Filters).Capacity = (int)uVar7;
  }
  (this->Filters).Size = 0;
  sVar6 = strlen(this->InputBuf);
  local_38.e = this->InputBuf + sVar6;
  local_38.b = this->InputBuf;
  TextRange::split(&local_38,',',out);
  this->CountGrep = 0;
  uVar8 = (this->Filters).Size;
  uVar7 = (ulong)uVar8;
  if (uVar8 != 0) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      if ((long)(int)uVar7 <= (long)uVar9) {
LAB_0012ef4d:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x353,
                      "value_type &ImVector<ImGuiTextFilter::TextRange>::operator[](int) [T = ImGuiTextFilter::TextRange]"
                     );
      }
      TextRange::trim_blanks((TextRange *)((long)&((this->Filters).Data)->b + lVar10));
      if ((long)(this->Filters).Size <= (long)uVar9) goto LAB_0012ef4d;
      pTVar3 = (this->Filters).Data;
      pcVar4 = *(char **)((long)&pTVar3->b + lVar10);
      if ((pcVar4 != *(char **)((long)&pTVar3->e + lVar10)) && (*pcVar4 != '-')) {
        this->CountGrep = this->CountGrep + 1;
      }
      uVar9 = uVar9 + 1;
      uVar7 = (ulong)(uint)out->Size;
      lVar10 = lVar10 + 0x10;
    } while (uVar9 != uVar7);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        Filters[i].trim_blanks();
        if (Filters[i].empty())
            continue;
        if (Filters[i].front() != '-')
            CountGrep += 1;
    }
}